

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O1

shared_ptr<ccs::CcsTracer> __thiscall
ccs::CcsTracer::makeLoggingTracer
          (CcsTracer *this,shared_ptr<ccs::CcsLogger> *logger,bool logAccesses)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var3;
  shared_ptr<ccs::CcsTracer> sVar4;
  
  pp_Var3 = (_func_int **)operator_new(0x30);
  pp_Var3[1] = (_func_int *)0x100000001;
  *pp_Var3 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001aa200;
  peVar1 = (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (logger->super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pp_Var3[2] = (_func_int *)&PTR__LoggingTracer_001aa250;
  pp_Var3[3] = (_func_int *)peVar1;
  pp_Var3[4] = (_func_int *)p_Var2;
  *(bool *)(pp_Var3 + 5) = logAccesses;
  this->_vptr_CcsTracer = pp_Var3 + 2;
  this[1]._vptr_CcsTracer = pp_Var3;
  sVar4.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__LoggingTracer_001aa250;
  sVar4.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<ccs::CcsTracer>)
         sVar4.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CcsTracer> CcsTracer::makeLoggingTracer(
  std::shared_ptr<CcsLogger> logger, bool logAccesses) {
  return std::make_shared<LoggingTracer>(std::move(logger), logAccesses);
}